

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_qdxt1.cpp
# Opt level: O2

void __thiscall crnlib::qdxt1::qdxt1(qdxt1 *this,task_pool *task_pool)

{
  this->m_pTask_pool = task_pool;
  this->m_main_thread_id = 0;
  this->m_canceled = false;
  this->m_progress_start = 0;
  this->m_progress_range = 100;
  *(undefined8 *)&this->m_num_blocks = 0;
  *(undefined8 *)((long)&this->m_pBlocks + 4) = 0;
  *(undefined8 *)((long)&this->m_pDst_elements + 4) = 0;
  qdxt1_params::clear(&this->m_params);
  this->m_max_selector_clusters = 0;
  this->m_prev_percentage_complete = -1;
  (this->m_endpoint_clusterizer).m_training_vecs.m_p =
       (pair<crnlib::vec<6U,_float>,_unsigned_int> *)0x0;
  (this->m_endpoint_clusterizer).m_training_vecs.m_size = 0;
  (this->m_endpoint_clusterizer).m_training_vecs.m_capacity = 0;
  (this->m_endpoint_clusterizer).m_nodes.m_p = (vq_node *)0x0;
  (this->m_endpoint_clusterizer).m_nodes.m_size = 0;
  (this->m_endpoint_clusterizer).m_nodes.m_capacity = 0;
  (this->m_endpoint_clusterizer).m_codebook.m_p = (vec<6U,_float> *)0x0;
  (this->m_endpoint_clusterizer).m_codebook.m_size = 0;
  (this->m_endpoint_clusterizer).m_codebook.m_capacity = 0;
  (this->m_endpoint_clusterizer).m_overall_variance = 0.0;
  (this->m_endpoint_clusterizer).m_split_index = 0;
  (this->m_endpoint_clusterizer).m_heap.m_p = (uint *)0x0;
  *(undefined8 *)((long)&(this->m_endpoint_clusterizer).m_heap.m_p + 5) = 0;
  *(undefined8 *)((long)&(this->m_endpoint_clusterizer).m_heap.m_capacity + 1) = 0;
  (this->m_endpoint_clusterizer).m_left_children.m_p = (uint *)0x0;
  (this->m_endpoint_clusterizer).m_left_children.m_size = 0;
  (this->m_endpoint_clusterizer).m_left_children.m_capacity = 0;
  (this->m_endpoint_clusterizer).m_right_children.m_p = (uint *)0x0;
  (this->m_endpoint_clusterizer).m_right_children.m_size = 0;
  (this->m_endpoint_clusterizer).m_right_children.m_capacity = 0;
  (this->m_endpoint_cluster_indices).m_p = (vector<unsigned_int> *)0x0;
  (this->m_endpoint_cluster_indices).m_size = 0;
  (this->m_endpoint_cluster_indices).m_capacity = 0;
  threaded_clusterizer<crnlib::vec<16U,_float>_>::threaded_clusterizer
            (&this->m_selector_clusterizer,task_pool);
  memset(this->m_cached_selector_cluster_indices,0,0x1010);
  (this->m_cluster_hash).m_hash_shift = 0x20;
  (this->m_cluster_hash).m_num_valid = 0;
  (this->m_cluster_hash).m_grow_threshold = 0;
  spinlock::spinlock(&this->m_cluster_hash_lock);
  return;
}

Assistant:

qdxt1::qdxt1(task_pool& task_pool) :
        m_pTask_pool(&task_pool),
        m_main_thread_id(0),
        m_canceled(false),
        m_progress_start(0),
        m_progress_range(100),
        m_num_blocks(0),
        m_pBlocks(nullptr),
        m_pDst_elements(nullptr),
        m_elements_per_block(0),
        m_max_selector_clusters(0),
        m_prev_percentage_complete(-1),
        m_selector_clusterizer(task_pool)
    {
    }